

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::WFXMLScanner::scanDocTypeDecl(WFXMLScanner *this)

{
  XMLCh XVar1;
  ReaderMgr *this_00;
  
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  XVar1 = ReaderMgr::skipUntilIn(this_00,L"[>");
  if (XVar1 == L'[') {
    do {
      XVar1 = ReaderMgr::getNextChar(this_00);
      if (XVar1 == L']') break;
    } while (XVar1 != L'\0');
  }
  do {
    XVar1 = ReaderMgr::getNextChar(this_00);
    if (XVar1 == L'>') {
      return;
    }
  } while (XVar1 != L'\0');
  return;
}

Assistant:

void WFXMLScanner::scanDocTypeDecl()
{
    // Just skips over it
    // REVISIT: Should we issue a warning
    static const XMLCh doctypeIE[] =
    {
        chOpenSquare, chCloseAngle, chNull
    };
    XMLCh nextCh = fReaderMgr.skipUntilIn(doctypeIE);

    if (nextCh == chOpenSquare)
        fReaderMgr.skipPastChar(chCloseSquare);

    fReaderMgr.skipPastChar(chCloseAngle);
}